

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::drawTranslateHandles(XFormWidget *this)

{
  double *pdVar1;
  pointer pVVar2;
  double dVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double __x;
  Vector3D c;
  double local_188;
  double local_168;
  double dStack_160;
  double local_158;
  double local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  double local_128;
  double dStack_120;
  double local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  undefined1 local_e8 [16];
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    uVar5 = 0;
    if (this->transformedMode != false) {
      uVar5 = ((byte)~this->objectMode & 1) * 2;
    }
    local_108 = (this->center).x;
    dStack_100 = (this->center).y;
    local_f8 = (this->center).z;
    dVar12 = (this->bounds).max.x - (this->bounds).min.x;
    dVar11 = (this->bounds).max.y - (this->bounds).min.y;
    dVar14 = (this->bounds).max.z - (this->bounds).min.z;
    local_148 = SQRT(dVar14 * dVar14 + dVar12 * dVar12 + dVar11 * dVar11) * 0.5;
    uStack_140 = 0;
    glLineWidth(0x41000000);
    glBegin(1);
    local_d8 = local_148 * 0.85;
    uVar8 = (ulong)uVar5;
    uStack_d0 = 0;
    local_e8._8_4_ = SUB84(local_d8,0);
    local_e8._0_8_ = local_d8;
    local_e8._12_4_ = (int)((ulong)local_d8 >> 0x20);
    lVar6 = uVar8 * 0x18;
    for (uVar10 = uVar8; uVar10 < 3; uVar10 = uVar10 + 1) {
      pVVar2 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_118 = *(double *)((long)&pVVar2->z + lVar6) * local_d8 + local_f8;
      pdVar1 = (double *)((long)&pVVar2->x + lVar6);
      local_128 = *pdVar1 * (double)local_e8._0_8_ + local_108;
      dStack_120 = pdVar1[1] * (double)local_e8._8_8_ + dStack_100;
      glColor4ubv(*(undefined8 *)
                   ((long)&(((this->axisColors).
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data + lVar6));
      glVertex3dv(&local_108);
      glVertex3dv(&local_128);
      lVar6 = lVar6 + 0x18;
    }
    glEnd();
    glBegin(4);
    local_98 = local_148 * 0.5 * 0.15;
    uStack_80 = 0;
    local_a8._8_4_ = SUB84(local_148,0);
    local_a8._0_8_ = local_148;
    local_a8._12_4_ = (int)((ulong)local_148 >> 0x20);
    dStack_90 = local_98;
    local_88 = local_98;
    while (uVar8 < 3) {
      pVVar2 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_118 = pVVar2[uVar8].z * local_148 + local_f8;
      local_128 = pVVar2[uVar8].x * (double)local_a8._0_8_ + local_108;
      dStack_120 = pVVar2[uVar8].y * (double)local_a8._8_8_ + dStack_100;
      local_158 = pVVar2[uVar8].z * local_d8 + local_f8;
      local_168 = pVVar2[uVar8].x * (double)local_e8._0_8_ + local_108;
      dStack_160 = pVVar2[uVar8].y * (double)local_e8._8_8_ + dStack_100;
      uVar10 = uVar8 + 1;
      uVar4 = uVar10;
      if (uVar10 == 3) {
        uVar4 = 0;
      }
      dVar12 = pVVar2[uVar4].z * local_88;
      uVar9 = (ulong)((int)uVar8 - 1);
      if (uVar8 == 0) {
        uVar9 = 2;
      }
      local_b8 = pVVar2[uVar4].x * local_98;
      dStack_b0 = pVVar2[uVar4].y * dStack_90;
      local_c8 = pVVar2[uVar9].x * local_98;
      dStack_c0 = pVVar2[uVar9].y * dStack_90;
      dVar11 = pVVar2[uVar9].z * local_88;
      glColor4ubv((this->axisColors).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      local_188 = 0.0;
      for (iVar7 = 1; uVar8 = uVar10, iVar7 != 9; iVar7 = iVar7 + 1) {
        dVar14 = local_188 * 6.283185307179586 * 0.125;
        local_138._0_8_ = dVar14;
        local_188 = local_188 + 1.0;
        __x = (double)iVar7 * 6.283185307179586 * 0.125;
        dVar14 = cos(dVar14);
        dVar13 = dVar12 * dVar14 + local_158;
        dVar3 = dVar14 * dStack_b0 + dStack_160;
        local_78._8_4_ = SUB84(dVar3,0);
        local_78._0_8_ = dVar14 * local_b8 + local_168;
        local_78._12_4_ = (int)((ulong)dVar3 >> 0x20);
        dVar14 = sin((double)local_138._0_8_);
        local_48 = (double)local_78._0_8_ - dVar14 * local_c8;
        dStack_40 = (double)local_78._8_8_ - dVar14 * dStack_c0;
        local_38 = dVar13 - dVar11 * dVar14;
        dVar14 = cos(__x);
        dVar13 = dVar12 * dVar14 + local_158;
        dVar3 = dVar14 * dStack_b0 + dStack_160;
        local_138._8_4_ = SUB84(dVar3,0);
        local_138._0_8_ = dVar14 * local_b8 + local_168;
        local_138._12_4_ = (int)((ulong)dVar3 >> 0x20);
        dVar14 = sin(__x);
        local_68 = (double)local_138._0_8_ - dVar14 * local_c8;
        dStack_60 = (double)local_138._8_8_ - dVar14 * dStack_c0;
        local_58 = dVar13 - dVar11 * dVar14;
        glVertex3dv(&local_128);
        glVertex3dv(&local_48);
        glVertex3dv(&local_68);
        glVertex3dv(&local_48);
        glVertex3dv(&local_168);
        glVertex3dv(&local_68);
      }
    }
    glEnd();
    if ((this->transformedMode == false) || (this->objectMode == true)) {
      drawCenterHandle(this);
    }
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawTranslateHandles() const
{
   const double arrowSize = .15;
   const int nSides = 8;

   if (target.object == nullptr) return;
   
   int startAxis = (transformedMode && !objectMode) ? 2 : 0;

   Vector3D c = center;
   double r = (bounds.max - bounds.min).norm() / 2.;

   // Draw arrow stems
   glLineWidth( 8. );
   glBegin( GL_LINES );
   for( int i = startAxis; i < 3; i++ )
   {
      Vector3D b = c + (1.-arrowSize)*r*axes[i];

      glColor4ubv( &axisColors[i][0] );

      glVertex3dv( &c.x );
      glVertex3dv( &b.x );
   }
   glEnd();

   // Draw arrow heads
   glBegin( GL_TRIANGLES );
   for( int i = startAxis; i < 3; i++ )
   {
      Vector3D a = c + r*axes[i];
      Vector3D b = c + (1.-arrowSize)*r*axes[i];
      Vector3D e0 = r*.5*arrowSize*axes[(i+1)%3];
      Vector3D e1 = r*.5*arrowSize*axes[(i+2)%3];

      glColor4ubv( &axisColors[i][0] );

      for( int j = 0; j < nSides; j++ )
      {
         double theta1 = 2.*M_PI * (double) j / (double) nSides;
         double theta2 = 2.*M_PI * (double) (j+1) / (double) nSides;
         Vector3D p0 = b + cos(theta1)*e0 - sin(theta1)*e1;
         Vector3D p1 = b + cos(theta2)*e0 - sin(theta2)*e1;

         glVertex3dv( &a.x );
         glVertex3dv( &p0.x );
         glVertex3dv( &p1.x );

         glVertex3dv( &p0.x );
         glVertex3dv( &b.x );
         glVertex3dv( &p1.x );
      }

   }
   glEnd();

   if (!transformedMode || objectMode) drawCenterHandle();
   glLineWidth( 1. );
}